

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O3

int search(ion_bpp_handle_t handle,ion_bpp_buffer_t *buf,void *key,ion_bpp_external_address_t rec,
          ion_bpp_key_t **mkey,ion_bpp_mode_e mode)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ion_bpp_node_t *piVar4;
  ion_bpp_key_t *piVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  piVar4 = buf->p;
  if (*(ushort *)piVar4 < 2) {
LAB_00109f83:
    *mkey = &piVar4->fkey;
    return -1;
  }
  iVar6 = (*(ushort *)piVar4 >> 1) - 1;
  bVar1 = false;
  iVar8 = 0;
  do {
    iVar7 = (iVar8 + iVar6) / 2;
    piVar5 = &buf->p->fkey + (long)iVar7 * (long)*(int *)((long)handle + 0xbc);
    *mkey = piVar5;
    cVar2 = (**(code **)((long)handle + 0x18))(key,piVar5,*(undefined4 *)((long)handle + 8));
    iVar3 = (int)cVar2;
    if ((cVar2 < '\0') || (mode == MODE_FGEQ && cVar2 == '\0')) {
      iVar6 = iVar7 + -1;
    }
    else if ((mode == MODE_LLEQ) || (cVar2 != '\0')) {
      iVar8 = iVar7 + 1;
    }
    else {
      if (*(int *)((long)handle + 0xc) == 0) {
        return 0;
      }
      if (mode == MODE_MATCH) {
        if (rec < *(long *)(*mkey + *(int *)((long)handle + 8))) {
          iVar3 = -1;
          goto LAB_00109f60;
        }
        if (rec <= *(long *)(*mkey + *(int *)((long)handle + 8))) {
          return 0;
        }
        iVar8 = iVar7 + 1;
        iVar3 = 1;
      }
      else {
        iVar3 = 0;
        if (mode == MODE_FIRST) {
          if (iVar7 <= iVar8) {
            return 0;
          }
          bVar1 = true;
          iVar3 = 0;
LAB_00109f60:
          iVar6 = iVar7 + -1;
        }
      }
    }
  } while (iVar8 <= iVar6);
  piVar4 = buf->p;
  if (*(ushort *)piVar4 < 2) goto LAB_00109f83;
  if ((mode == MODE_FIRST && bVar1) && *(int *)((long)handle + 0xc) != 0) {
    *mkey = *mkey + *(int *)((long)handle + 0xbc);
    return 0;
  }
  if (mode == MODE_FGEQ) {
    iVar6 = *(int *)((long)handle + 0xbc);
    *mkey = &piVar4->fkey + (long)iVar6 * (long)iVar8;
    cVar2 = (**(code **)((long)handle + 0x18))
                      (key,&piVar4->fkey + (long)iVar6 * (long)iVar8,
                       *(undefined4 *)((long)handle + 8));
    piVar4 = buf->p;
    if (((int)((*(ushort *)piVar4 >> 1) - 1) <= iVar8) || (-1 < cVar2)) goto LAB_0010a083;
    lVar9 = (long)iVar8 + 1;
  }
  else {
    if (mode != MODE_LLEQ) {
      return iVar3;
    }
    lVar9 = (long)iVar6;
    iVar8 = *(int *)((long)handle + 0xbc);
    *mkey = &piVar4->fkey + (long)iVar8 * (lVar9 + 1);
    cVar2 = (**(code **)((long)handle + 0x18))
                      (key,&piVar4->fkey + (long)iVar8 * (lVar9 + 1),
                       *(undefined4 *)((long)handle + 8));
    piVar4 = buf->p;
    if ((iVar6 != (*(ushort *)piVar4 >> 1) - 1) && ((iVar6 == -1 || ('\0' < cVar2))))
    goto LAB_0010a083;
  }
  iVar6 = *(int *)((long)handle + 0xbc);
  *mkey = &piVar4->fkey + iVar6 * lVar9;
  cVar2 = (**(code **)((long)handle + 0x18))
                    (key,&piVar4->fkey + iVar6 * lVar9,*(undefined4 *)((long)handle + 8));
LAB_0010a083:
  return (int)cVar2;
}

Assistant:

static int
search(
	ion_bpp_handle_t			handle,
	ion_bpp_buffer_t			*buf,
	void						*key,
	ion_bpp_external_address_t	rec,
	ion_bpp_key_t				**mkey,
	ion_bpp_mode_e				mode
) {
	/*
	 * input:
	 *   p					  pointer to node
	 *   key					key to find
	 *   rec					record address (dupkey only)
	 * output:
	 *   k					  pointer to ion_bpp_key_t info
	 * returns:
	 *   CC_EQ				  key = mkey
	 *   CC_LT				  key < mkey
	 *   CC_GT				  key > mkey
	*/
	ion_bpp_h_node_t	*h = handle;
	int					cc;		/* condition code */
	int					m;		/* midpoint of search */
	int					lb;		/* lower-bound of binary search */
	int					ub;		/* upper-bound of binary search */
	ion_bpp_bool_t		foundDup;			/* true if found a duplicate key */

	/* scan current node for key using binary search */
	foundDup	= boolean_false;
	lb			= 0;
	ub			= ct(buf) - 1;

	while (lb <= ub) {
		m		= (lb + ub) / 2;
		*mkey	= fkey(buf) + ks(m);
		cc		= h->comp(key, key(*mkey), (ion_key_size_t) (h->keySize));

		if ((cc < 0) || ((cc == 0) && (MODE_FGEQ == mode))) {
			/* key less than key[m] */
			ub = m - 1;
		}
		else if ((cc > 0) || ((cc == 0) && (MODE_LLEQ == mode))) {
			/* key greater than key[m] */
			lb = m + 1;
		}
		else {
			/* keys match */
			if (h->dupKeys) {
				switch (mode) {
					case MODE_FIRST:
						/* backtrack to first key */
						ub = m - 1;

						if (lb > ub) {
							return ION_CC_EQ;
						}

						foundDup = boolean_true;
						break;

					case MODE_MATCH:

						/* rec's must also match */
						if (rec < rec(*mkey)) {
							ub	= m - 1;
							cc	= ION_CC_LT;
						}
						else if (rec > rec(*mkey)) {
							lb	= m + 1;
							cc	= ION_CC_GT;
						}
						else {
							return ION_CC_EQ;
						}

						break;

					case MODE_FGEQ:
					case MODE_LLEQ:	/* nop */
						break;
				}
			}
			else {
				return cc;
			}
		}
	}

	if (ct(buf) == 0) {
		/* empty list */
		*mkey = fkey(buf);
		return ION_CC_LT;
	}

	if (h->dupKeys && (mode == MODE_FIRST) && foundDup) {
		/* next key is first key in set of duplicates */
		*mkey += ks(1);
		return ION_CC_EQ;
	}

	if (MODE_LLEQ == mode) {
		*mkey	= fkey(buf) + ks(ub + 1);
		cc		= h->comp(key, key(*mkey), (ion_key_size_t) (h->keySize));

		if ((ub == ct(buf) - 1) || ((ub != -1) && (cc <= 0))) {
			*mkey	= fkey(buf) + ks(ub);
			cc		= h->comp(key, key(*mkey), (ion_key_size_t) (h->keySize));
		}

		return cc;
	}

	if (MODE_FGEQ == mode) {
		*mkey	= fkey(buf) + ks(lb);
		cc		= h->comp(key, key(*mkey), (ion_key_size_t) (h->keySize));

		if ((lb < ct(buf) - 1) && (cc < 0)) {
			*mkey	= fkey(buf) + ks(lb + 1);
			cc		= h->comp(key, key(*mkey), (ion_key_size_t) (h->keySize));
		}

		return cc;
	}

	/* didn't find key */
	return cc;
}